

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O0

int mg_session_check_struct_header(mg_session *session,uint8_t marker,uint8_t signature)

{
  char in_DL;
  char in_SIL;
  mg_session *in_RDI;
  uint8_t *header;
  int local_4;
  
  if (in_RDI->in_end < in_RDI->in_cursor + 2) {
    mg_session_set_error(in_RDI,"unexpected end of message");
    local_4 = -6;
  }
  else if (in_RDI->in_buffer[in_RDI->in_cursor] == in_SIL) {
    if ((in_RDI->in_buffer + in_RDI->in_cursor)[1] == in_DL) {
      in_RDI->in_cursor = in_RDI->in_cursor + 2;
      local_4 = 0;
    }
    else {
      mg_session_set_error(in_RDI,"wrong struct signature");
      local_4 = -6;
    }
  }
  else {
    mg_session_set_error(in_RDI,"wrong value marker");
    local_4 = -6;
  }
  return local_4;
}

Assistant:

int mg_session_check_struct_header(mg_session *session, uint8_t marker,
                                   uint8_t signature) {
  if (session->in_cursor + 2 > session->in_end) {
    mg_session_set_error(session, "unexpected end of message");
    return MG_ERROR_DECODING_FAILED;
  }
  uint8_t *header = (uint8_t *)(session->in_buffer + session->in_cursor);
  if (header[0] != marker) {
    mg_session_set_error(session, "wrong value marker");
    return MG_ERROR_DECODING_FAILED;
  }
  if (header[1] != signature) {
    mg_session_set_error(session, "wrong struct signature");
    return MG_ERROR_DECODING_FAILED;
  }
  session->in_cursor += 2;
  return 0;
}